

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicMax::CheckIndexed(BasicMax *this,GLenum target,GLint *min_values)

{
  uint local_60;
  uint local_5c;
  GLuint c_4;
  GLuint c_3;
  GLuint c_2;
  GLuint c_1;
  GLuint c;
  GLboolean b;
  GLdouble d;
  ulong uStack_38;
  GLfloat f;
  GLint64 i64;
  GLint *pGStack_28;
  GLint i;
  GLint *min_values_local;
  BasicMax *pBStack_18;
  GLenum target_local;
  BasicMax *this_local;
  
  pGStack_28 = min_values;
  min_values_local._4_4_ = target;
  pBStack_18 = this;
  for (c_2 = 0; c_2 < 3; c_2 = c_2 + 1) {
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,c_2,(GLint *)((long)&i64 + 4));
    if ((int)i64._4_4_ < pGStack_28[c_2]) {
      anon_unknown_0::Output
                ("Is %d should be at least %d.\n",(ulong)i64._4_4_,(ulong)(uint)pGStack_28[c_2]);
      return false;
    }
  }
  for (c_3 = 0; c_3 < 3; c_3 = c_3 + 1) {
    glu::CallLogWrapper::glGetInteger64i_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,c_3,(GLint64 *)&stack0xffffffffffffffc8)
    ;
    if ((long)uStack_38 < (long)pGStack_28[c_3]) {
      anon_unknown_0::Output
                ("Is %d should be at least %d.\n",uStack_38 & 0xffffffff,
                 (ulong)(uint)pGStack_28[c_3]);
      return false;
    }
  }
  for (c_4 = 0; c_4 < 3; c_4 = c_4 + 1) {
    glu::CallLogWrapper::glGetFloati_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,c_4,(GLfloat *)((long)&d + 4));
    if (d._4_4_ < (float)pGStack_28[c_4]) {
      anon_unknown_0::Output
                ("Is %d should be at least %d.\n",(ulong)(uint)(int)d._4_4_,
                 (ulong)(uint)pGStack_28[c_4]);
      return false;
    }
  }
  for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
    glu::CallLogWrapper::glGetDoublei_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,local_5c,(GLdouble *)&c);
    if (_c < (double)pGStack_28[local_5c]) {
      anon_unknown_0::Output
                ("Is %d should be at least %d.\n",(ulong)(uint)(int)_c,
                 (ulong)(uint)pGStack_28[local_5c]);
      return false;
    }
  }
  local_60 = 0;
  while( true ) {
    if (2 < local_60) {
      return true;
    }
    glu::CallLogWrapper::glGetBooleani_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,local_60,(GLboolean *)((long)&c_1 + 3));
    if (c_1._3_1_ == '\0') break;
    local_60 = local_60 + 1;
  }
  anon_unknown_0::Output("Is GL_FALSE should be at least GL_TRUE.\n");
  return false;
}

Assistant:

bool CheckIndexed(GLenum target, const GLint* min_values)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		for (GLuint c = 0; c < 3; c++)
		{
			glGetIntegeri_v(target, c, &i);
			if (i < min_values[c])
			{
				Output("Is %d should be at least %d.\n", i, min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetInteger64i_v(target, c, &i64);
			if (i64 < static_cast<GLint64>(min_values[c]))
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetFloati_v(target, c, &f);
			if (f < static_cast<GLfloat>(min_values[c]))
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(f), min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetDoublei_v(target, c, &d);
			if (d < static_cast<GLdouble>(min_values[c]))
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(d), min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetBooleani_v(target, c, &b);
			if (b == GL_FALSE)
			{
				Output("Is GL_FALSE should be at least GL_TRUE.\n");
				return false;
			}
		}

		return true;
	}